

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnF64ConstExpr
          (BinaryReaderInterp *this,uint64_t value_bits)

{
  bool bVar1;
  Type local_50;
  Location local_48;
  Enum local_24;
  uint64_t local_20;
  uint64_t value_bits_local;
  BinaryReaderInterp *this_local;
  
  local_20 = value_bits;
  value_bits_local = (uint64_t)this;
  GetLocation(&local_48,this);
  Type::Type(&local_50,F64);
  local_24 = (Enum)SharedValidator::OnConst(&this->validator_,&local_48,local_50);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,F64Const,local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnF64ConstExpr(uint64_t value_bits) {
  CHECK_RESULT(validator_.OnConst(GetLocation(), Type::F64));
  istream_.Emit(Opcode::F64Const, value_bits);
  return Result::Ok;
}